

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O1

block dpf_seed(block *seed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  longlong in_RAX;
  undefined4 extraout_var;
  longlong extraout_RAX;
  longlong in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  uint uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  uint uVar13;
  uint uVar14;
  block alVar15;
  block cur_seed;
  longlong local_18;
  longlong lStack_10;
  
  current_rand_index = 0;
  if (seed == (block *)0x0) {
    iVar9 = RAND_bytes((uchar *)&local_18,0x10);
    in_RAX = CONCAT44(extraout_var,iVar9);
    in_RDX = extraout_RDX;
    if (iVar9 == 0) {
      dpf_seed_cold_1();
      in_RAX = extraout_RAX;
      in_RDX = extraout_RDX_00;
      goto LAB_00102168;
    }
  }
  else {
    local_18 = (*seed)[0];
    lStack_10 = (*seed)[1];
  }
  rand_aes_key.rd_key[0][1] = lStack_10;
  rand_aes_key.rd_key[0][0] = local_18;
  auVar12 = aeskeygenassist((undefined1  [16])rand_aes_key.rd_key[0],1);
  uVar10 = (uint)local_18;
  uVar11 = (uint)((ulong)local_18 >> 0x20);
  uVar14 = (uint)lStack_10 ^ uVar11;
  uVar13 = auVar12._12_4_;
  rand_aes_key.rd_key[1][0]._0_4_ = uVar10 ^ uVar13;
  rand_aes_key.rd_key[1][0]._4_4_ = uVar10 ^ uVar11 ^ uVar13;
  rand_aes_key.rd_key[1][1]._0_4_ = uVar10 ^ uVar14 ^ uVar13;
  rand_aes_key.rd_key[1][1]._4_4_ = uVar14 ^ (uint)((ulong)lStack_10 >> 0x20) ^ uVar10 ^ uVar13;
  auVar12._4_4_ = rand_aes_key.rd_key[1][0]._4_4_;
  auVar12._0_4_ = (uint)rand_aes_key.rd_key[1][0];
  auVar12._8_4_ = (uint)rand_aes_key.rd_key[1][1];
  auVar12._12_4_ = rand_aes_key.rd_key[1][1]._4_4_;
  auVar12 = aeskeygenassist(auVar12,2);
  uVar10 = auVar12._12_4_;
  rand_aes_key.rd_key[2][0]._0_4_ = (uint)rand_aes_key.rd_key[1][0] ^ uVar10;
  rand_aes_key.rd_key[2][0]._4_4_ =
       (uint)rand_aes_key.rd_key[1][0] ^ rand_aes_key.rd_key[1][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[2][1]._0_4_ =
       (uint)rand_aes_key.rd_key[1][0] ^
       (uint)rand_aes_key.rd_key[1][1] ^ rand_aes_key.rd_key[1][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[2][1]._4_4_ =
       (uint)rand_aes_key.rd_key[1][1] ^ rand_aes_key.rd_key[1][0]._4_4_ ^
       rand_aes_key.rd_key[1][1]._4_4_ ^ (uint)rand_aes_key.rd_key[1][0] ^ uVar10;
  auVar5._4_4_ = rand_aes_key.rd_key[2][0]._4_4_;
  auVar5._0_4_ = (uint)rand_aes_key.rd_key[2][0];
  auVar5._8_4_ = (uint)rand_aes_key.rd_key[2][1];
  auVar5._12_4_ = rand_aes_key.rd_key[2][1]._4_4_;
  auVar12 = aeskeygenassist(auVar5,4);
  uVar10 = auVar12._12_4_;
  rand_aes_key.rd_key[3][0]._0_4_ = (uint)rand_aes_key.rd_key[2][0] ^ uVar10;
  rand_aes_key.rd_key[3][0]._4_4_ =
       (uint)rand_aes_key.rd_key[2][0] ^ rand_aes_key.rd_key[2][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[3][1]._0_4_ =
       (uint)rand_aes_key.rd_key[2][0] ^
       (uint)rand_aes_key.rd_key[2][1] ^ rand_aes_key.rd_key[2][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[3][1]._4_4_ =
       (uint)rand_aes_key.rd_key[2][1] ^ rand_aes_key.rd_key[2][0]._4_4_ ^
       rand_aes_key.rd_key[2][1]._4_4_ ^ (uint)rand_aes_key.rd_key[2][0] ^ uVar10;
  auVar1._4_4_ = rand_aes_key.rd_key[3][0]._4_4_;
  auVar1._0_4_ = (uint)rand_aes_key.rd_key[3][0];
  auVar1._8_4_ = (uint)rand_aes_key.rd_key[3][1];
  auVar1._12_4_ = rand_aes_key.rd_key[3][1]._4_4_;
  auVar12 = aeskeygenassist(auVar1,8);
  uVar10 = auVar12._12_4_;
  rand_aes_key.rd_key[4][0]._0_4_ = (uint)rand_aes_key.rd_key[3][0] ^ uVar10;
  rand_aes_key.rd_key[4][0]._4_4_ =
       (uint)rand_aes_key.rd_key[3][0] ^ rand_aes_key.rd_key[3][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[4][1]._0_4_ =
       (uint)rand_aes_key.rd_key[3][0] ^
       (uint)rand_aes_key.rd_key[3][1] ^ rand_aes_key.rd_key[3][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[4][1]._4_4_ =
       (uint)rand_aes_key.rd_key[3][1] ^ rand_aes_key.rd_key[3][0]._4_4_ ^
       rand_aes_key.rd_key[3][1]._4_4_ ^ (uint)rand_aes_key.rd_key[3][0] ^ uVar10;
  auVar6._4_4_ = rand_aes_key.rd_key[4][0]._4_4_;
  auVar6._0_4_ = (uint)rand_aes_key.rd_key[4][0];
  auVar6._8_4_ = (uint)rand_aes_key.rd_key[4][1];
  auVar6._12_4_ = rand_aes_key.rd_key[4][1]._4_4_;
  auVar12 = aeskeygenassist(auVar6,0x10);
  uVar10 = auVar12._12_4_;
  rand_aes_key.rd_key[5][0]._0_4_ = (uint)rand_aes_key.rd_key[4][0] ^ uVar10;
  rand_aes_key.rd_key[5][0]._4_4_ =
       (uint)rand_aes_key.rd_key[4][0] ^ rand_aes_key.rd_key[4][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[5][1]._0_4_ =
       (uint)rand_aes_key.rd_key[4][0] ^
       (uint)rand_aes_key.rd_key[4][1] ^ rand_aes_key.rd_key[4][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[5][1]._4_4_ =
       (uint)rand_aes_key.rd_key[4][1] ^ rand_aes_key.rd_key[4][0]._4_4_ ^
       rand_aes_key.rd_key[4][1]._4_4_ ^ (uint)rand_aes_key.rd_key[4][0] ^ uVar10;
  auVar2._4_4_ = rand_aes_key.rd_key[5][0]._4_4_;
  auVar2._0_4_ = (uint)rand_aes_key.rd_key[5][0];
  auVar2._8_4_ = (uint)rand_aes_key.rd_key[5][1];
  auVar2._12_4_ = rand_aes_key.rd_key[5][1]._4_4_;
  auVar12 = aeskeygenassist(auVar2,0x20);
  uVar10 = auVar12._12_4_;
  rand_aes_key.rd_key[6][0]._0_4_ = (uint)rand_aes_key.rd_key[5][0] ^ uVar10;
  rand_aes_key.rd_key[6][0]._4_4_ =
       (uint)rand_aes_key.rd_key[5][0] ^ rand_aes_key.rd_key[5][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[6][1]._0_4_ =
       (uint)rand_aes_key.rd_key[5][0] ^
       (uint)rand_aes_key.rd_key[5][1] ^ rand_aes_key.rd_key[5][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[6][1]._4_4_ =
       (uint)rand_aes_key.rd_key[5][1] ^ rand_aes_key.rd_key[5][0]._4_4_ ^
       rand_aes_key.rd_key[5][1]._4_4_ ^ (uint)rand_aes_key.rd_key[5][0] ^ uVar10;
  auVar7._4_4_ = rand_aes_key.rd_key[6][0]._4_4_;
  auVar7._0_4_ = (uint)rand_aes_key.rd_key[6][0];
  auVar7._8_4_ = (uint)rand_aes_key.rd_key[6][1];
  auVar7._12_4_ = rand_aes_key.rd_key[6][1]._4_4_;
  auVar12 = aeskeygenassist(auVar7,0x40);
  uVar10 = auVar12._12_4_;
  rand_aes_key.rd_key[7][0]._0_4_ = (uint)rand_aes_key.rd_key[6][0] ^ uVar10;
  rand_aes_key.rd_key[7][0]._4_4_ =
       (uint)rand_aes_key.rd_key[6][0] ^ rand_aes_key.rd_key[6][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[7][1]._0_4_ =
       (uint)rand_aes_key.rd_key[6][0] ^
       (uint)rand_aes_key.rd_key[6][1] ^ rand_aes_key.rd_key[6][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[7][1]._4_4_ =
       (uint)rand_aes_key.rd_key[6][1] ^ rand_aes_key.rd_key[6][0]._4_4_ ^
       rand_aes_key.rd_key[6][1]._4_4_ ^ (uint)rand_aes_key.rd_key[6][0] ^ uVar10;
  auVar3._4_4_ = rand_aes_key.rd_key[7][0]._4_4_;
  auVar3._0_4_ = (uint)rand_aes_key.rd_key[7][0];
  auVar3._8_4_ = (uint)rand_aes_key.rd_key[7][1];
  auVar3._12_4_ = rand_aes_key.rd_key[7][1]._4_4_;
  auVar12 = aeskeygenassist(auVar3,0x80);
  uVar10 = auVar12._12_4_;
  rand_aes_key.rd_key[8][0]._0_4_ = (uint)rand_aes_key.rd_key[7][0] ^ uVar10;
  rand_aes_key.rd_key[8][0]._4_4_ =
       (uint)rand_aes_key.rd_key[7][0] ^ rand_aes_key.rd_key[7][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[8][1]._0_4_ =
       (uint)rand_aes_key.rd_key[7][0] ^
       (uint)rand_aes_key.rd_key[7][1] ^ rand_aes_key.rd_key[7][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[8][1]._4_4_ =
       (uint)rand_aes_key.rd_key[7][1] ^ rand_aes_key.rd_key[7][0]._4_4_ ^
       rand_aes_key.rd_key[7][1]._4_4_ ^ (uint)rand_aes_key.rd_key[7][0] ^ uVar10;
  auVar8._4_4_ = rand_aes_key.rd_key[8][0]._4_4_;
  auVar8._0_4_ = (uint)rand_aes_key.rd_key[8][0];
  auVar8._8_4_ = (uint)rand_aes_key.rd_key[8][1];
  auVar8._12_4_ = rand_aes_key.rd_key[8][1]._4_4_;
  auVar12 = aeskeygenassist(auVar8,0x1b);
  uVar10 = auVar12._12_4_;
  rand_aes_key.rd_key[9][0]._0_4_ = (uint)rand_aes_key.rd_key[8][0] ^ uVar10;
  rand_aes_key.rd_key[9][0]._4_4_ =
       (uint)rand_aes_key.rd_key[8][0] ^ rand_aes_key.rd_key[8][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[9][1]._0_4_ =
       (uint)rand_aes_key.rd_key[8][0] ^
       (uint)rand_aes_key.rd_key[8][1] ^ rand_aes_key.rd_key[8][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[9][1]._4_4_ =
       (uint)rand_aes_key.rd_key[8][1] ^ rand_aes_key.rd_key[8][0]._4_4_ ^
       rand_aes_key.rd_key[8][1]._4_4_ ^ (uint)rand_aes_key.rd_key[8][0] ^ uVar10;
  auVar4._4_4_ = rand_aes_key.rd_key[9][0]._4_4_;
  auVar4._0_4_ = (uint)rand_aes_key.rd_key[9][0];
  auVar4._8_4_ = (uint)rand_aes_key.rd_key[9][1];
  auVar4._12_4_ = rand_aes_key.rd_key[9][1]._4_4_;
  auVar12 = aeskeygenassist(auVar4,0x36);
  uVar10 = auVar12._12_4_;
  rand_aes_key.rd_key[10][0]._0_4_ = (uint)rand_aes_key.rd_key[9][0] ^ uVar10;
  rand_aes_key.rd_key[10][0]._4_4_ =
       (uint)rand_aes_key.rd_key[9][0] ^ rand_aes_key.rd_key[9][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[10][1]._0_4_ =
       (uint)rand_aes_key.rd_key[9][0] ^
       (uint)rand_aes_key.rd_key[9][1] ^ rand_aes_key.rd_key[9][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[10][1]._4_4_ =
       (uint)rand_aes_key.rd_key[9][1] ^ rand_aes_key.rd_key[9][0]._4_4_ ^
       rand_aes_key.rd_key[9][1]._4_4_ ^ (uint)rand_aes_key.rd_key[9][0] ^ uVar10;
  rand_aes_key.rounds = 10;
LAB_00102168:
  alVar15[1] = in_RDX;
  alVar15[0] = in_RAX;
  return alVar15;
}

Assistant:

block
dpf_seed(block *seed)
{
    block cur_seed;
    current_rand_index = 0;
    if (seed) {
        cur_seed = *seed;
    } else {
        if (RAND_bytes((unsigned char *) &cur_seed, 16) == 0) {
            fprintf(stderr, "** unable to seed securely\n");
            return dpf_zero_block();
        }
    }
    AES_set_encrypt_key(cur_seed, &rand_aes_key);
    return cur_seed;
}